

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O1

void add_struct_ptr_member_fn(File *fp,void **dest,OffsetEntry *oe,char *format)

{
  uint uVar1;
  char **ppcVar2;
  char *pcVar3;
  int iVar4;
  
  if (fp->binary == 0) {
    if (*format == '&') {
      iVar4 = strcmp(oe->name,"NULL");
      format = format + (iVar4 == 0);
    }
    if (fp->first_member == 0) {
      myfprintf(fp->fp,", ");
    }
    myfprintf(fp->fp,format,oe->name);
    goto LAB_00138cac;
  }
  *dest = (void *)(long)oe->offset;
  ppcVar2 = (fp->relocations).v;
  if (ppcVar2 == (char **)0x0) {
    pcVar3 = (fp->tables).start;
    (fp->relocations).v = (fp->relocations).e;
    uVar1 = (fp->relocations).n;
    (fp->relocations).n = uVar1 + 1;
    (fp->relocations).e[uVar1] = (char *)((long)dest - (long)pcVar3);
    goto LAB_00138cac;
  }
  uVar1 = (fp->relocations).n;
  if (ppcVar2 == (fp->relocations).e) {
    if (2 < uVar1) goto LAB_00138c9c;
    pcVar3 = (fp->tables).start;
  }
  else {
    if ((uVar1 & 7) == 0) {
LAB_00138c9c:
      vec_add_internal(&fp->relocations,(void *)((long)dest - (long)(fp->tables).start));
      goto LAB_00138cac;
    }
    pcVar3 = (fp->tables).start;
  }
  (fp->relocations).n = uVar1 + 1;
  ppcVar2[uVar1] = (char *)((long)dest - (long)pcVar3);
LAB_00138cac:
  fp->first_member = 0;
  return;
}

Assistant:

static void add_struct_ptr_member_fn(File *fp, void **dest, OffsetEntry *oe, char *format) {
  if (fp->binary) {
    *dest = (void *)(uintptr_t)oe->offset;
    vec_add(&fp->relocations, (void *)((char *)dest - fp->tables.start));
  } else {
    if (*format == '&' && strcmp(oe->name, "NULL") == 0) format++;
    if (!fp->first_member) fprintf(fp->fp, ", ");
    fprintf(fp->fp, format, oe->name);
  }
  fp->first_member = 0;
}